

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O0

void set_plane_n4(MACROBLOCKD *xd,int bw,int bh,int num_planes)

{
  uint8_t uVar1;
  int i;
  int num_planes_local;
  int bh_local;
  int bw_local;
  MACROBLOCKD *xd_local;
  
  for (i = 0; i < num_planes; i = i + 1) {
    xd->plane[i].width = (uint8_t)((bw << 2) >> ((byte)xd->plane[i].subsampling_x & 0x1f));
    xd->plane[i].height = (uint8_t)((bh << 2) >> ((byte)xd->plane[i].subsampling_y & 0x1f));
    if (xd->plane[i].width < 5) {
      uVar1 = '\x04';
    }
    else {
      uVar1 = xd->plane[i].width;
    }
    xd->plane[i].width = uVar1;
    if (xd->plane[i].height < 5) {
      uVar1 = '\x04';
    }
    else {
      uVar1 = xd->plane[i].height;
    }
    xd->plane[i].height = uVar1;
  }
  return;
}

Assistant:

static inline void set_plane_n4(MACROBLOCKD *const xd, int bw, int bh,
                                const int num_planes) {
  int i;
  for (i = 0; i < num_planes; i++) {
    xd->plane[i].width = (bw * MI_SIZE) >> xd->plane[i].subsampling_x;
    xd->plane[i].height = (bh * MI_SIZE) >> xd->plane[i].subsampling_y;

    xd->plane[i].width = AOMMAX(xd->plane[i].width, 4);
    xd->plane[i].height = AOMMAX(xd->plane[i].height, 4);
  }
}